

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O0

OutputFile * __thiscall re2c::OutputFile::wc(OutputFile *this,char c)

{
  ostream *poVar1;
  char c_local;
  OutputFile *this_local;
  
  poVar1 = stream(this);
  std::operator<<(poVar1,c);
  return this;
}

Assistant:

OutputFile & OutputFile::wc (char c)
{
	stream () << c;
	return *this;
}